

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O1

bool __thiscall Employee::validate(Employee *this,string *id)

{
  pointer pcVar1;
  bool bVar2;
  string local_38;
  
  pcVar1 = (id->_M_dataplus)._M_p;
  if (pcVar1[2] == '*') {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + id->_M_string_length);
    bVar2 = Person::validate(&this->super_Person,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Employee::validate(string id) {
    if (id[2] != '*')
        return false;
    return Person::validate(id);
}